

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

size_t ECDSA_SIG_max_len(size_t order_len)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  
  uVar4 = order_len + 1;
  lVar3 = 1;
  if (0x7f < uVar4) {
    do {
      lVar3 = lVar3 + 1;
      bVar1 = 0xff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar1);
  }
  uVar4 = lVar3 + order_len + 2;
  if (order_len <= uVar4 && -1 < (long)uVar4) {
    uVar2 = uVar4 * 2;
    lVar3 = 1;
    uVar5 = uVar2;
    if (0x3f < uVar4) {
      do {
        lVar3 = lVar3 + 1;
        bVar1 = 0xff < uVar5;
        uVar5 = uVar5 >> 8;
      } while (bVar1);
    }
    uVar4 = lVar3 + uVar2 + 1;
    sVar6 = 0;
    if (uVar2 <= uVar4) {
      sVar6 = uVar4;
    }
    return sVar6;
  }
  return 0;
}

Assistant:

size_t ECDSA_SIG_max_len(size_t order_len) {
  // Compute the maximum length of an |order_len| byte integer. Defensively
  // assume that the leading 0x00 is included.
  size_t integer_len = 1 /* tag */ + der_len_len(order_len + 1) + 1 + order_len;
  if (integer_len < order_len) {
    return 0;
  }
  // An ECDSA signature is two INTEGERs.
  size_t value_len = 2 * integer_len;
  if (value_len < integer_len) {
    return 0;
  }
  // Add the header.
  size_t ret = 1 /* tag */ + der_len_len(value_len) + value_len;
  if (ret < value_len) {
    return 0;
  }
  return ret;
}